

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::start_raytracing(PathTracer *this)

{
  reference __s;
  thread *this_00;
  reference pptVar1;
  PathTracer *local_50;
  code *local_48;
  undefined8 local_40;
  int local_34;
  int i;
  ulong local_20;
  size_t x;
  size_t y;
  PathTracer *this_local;
  
  if (this->state == READY) {
    y = (size_t)this;
    std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::clear(&this->rayLog);
    WorkQueue<CMU462::WorkItem>::clear(&this->workQueue);
    this->state = RENDERING;
    this->continueRaytracing = true;
    std::__atomic_base<int>::operator=(&(this->workerDoneCount).super___atomic_base<int>,0);
    HDRImageBuffer::clear(&this->sampleBuffer);
    ImageBuffer::clear(&this->frameBuffer);
    this->num_tiles_w = (this->sampleBuffer).w / this->imageTileSize + 1;
    this->num_tiles_h = (this->sampleBuffer).h / this->imageTileSize + 1;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->tile_samples,this->num_tiles_w * this->num_tiles_h);
    __s = std::vector<int,_std::allocator<int>_>::operator[](&this->tile_samples,0);
    memset(__s,0,this->num_tiles_w * this->num_tiles_h * 4);
    for (x = 0; x < (this->sampleBuffer).h; x = this->imageTileSize + x) {
      for (local_20 = 0; local_20 < (this->sampleBuffer).w;
          local_20 = this->imageTileSize + local_20) {
        WorkItem::WorkItem((WorkItem *)&stack0xffffffffffffffd0,(int)local_20,(int)x,
                           (int)this->imageTileSize,(int)this->imageTileSize);
        WorkQueue<CMU462::WorkItem>::put_work(&this->workQueue,(WorkItem *)&stack0xffffffffffffffd0)
        ;
      }
    }
    fprintf(_stdout,"[PathTracer] Rendering... ");
    fflush(_stdout);
    for (local_34 = 0; (ulong)(long)local_34 < this->numWorkerThreads; local_34 = local_34 + 1) {
      this_00 = (thread *)operator_new(8);
      local_48 = worker_thread;
      local_40 = 0;
      local_50 = this;
      std::thread::thread<void(CMU462::PathTracer::*)(),CMU462::PathTracer*,void>
                (this_00,(type *)&local_48,&local_50);
      pptVar1 = std::vector<std::thread_*,_std::allocator<std::thread_*>_>::operator[]
                          (&this->workerThreads,(long)local_34);
      *pptVar1 = this_00;
    }
  }
  return;
}

Assistant:

void PathTracer::start_raytracing() {
    if (state != READY) return;

    rayLog.clear();
    workQueue.clear();

    state = RENDERING;
    continueRaytracing = true;
    workerDoneCount = 0;

    sampleBuffer.clear();
    frameBuffer.clear();
    num_tiles_w = sampleBuffer.w / imageTileSize + 1;
    num_tiles_h = sampleBuffer.h / imageTileSize + 1;
    tile_samples.resize(num_tiles_w * num_tiles_h);
    memset(&tile_samples[0], 0, num_tiles_w * num_tiles_h * sizeof(int));

    // populate the tile work queue
    for (size_t y = 0; y < sampleBuffer.h; y += imageTileSize) {
      for (size_t x = 0; x < sampleBuffer.w; x += imageTileSize) {
        workQueue.put_work(WorkItem(x, y, imageTileSize, imageTileSize));
      }
    }

    // launch threads
    fprintf(stdout, "[PathTracer] Rendering... "); fflush(stdout);
    for (int i=0; i<numWorkerThreads; i++) {
      workerThreads[i] = new std::thread(&PathTracer::worker_thread, this);
    }
  }